

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O2

FT_Error cff_get_kerning(FT_Face ttface,FT_UInt left_glyph,FT_UInt right_glyph,FT_Vector *kerning)

{
  long lVar1;
  int iVar2;
  TT_Face face;
  
  lVar1 = *(long *)&ttface[3].units_per_EM;
  kerning->x = 0;
  kerning->y = 0;
  if (lVar1 != 0) {
    iVar2 = (**(code **)(lVar1 + 0xa8))();
    kerning->x = (long)iVar2;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cff_get_kerning( FT_Face     ttface,          /* TT_Face */
                   FT_UInt     left_glyph,
                   FT_UInt     right_glyph,
                   FT_Vector*  kerning )
  {
    TT_Face       face = (TT_Face)ttface;
    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;


    kerning->x = 0;
    kerning->y = 0;

    if ( sfnt )
      kerning->x = sfnt->get_kerning( face, left_glyph, right_glyph );

    return FT_Err_Ok;
  }